

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestChecks.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c003::TestCheckCloseFailureIncludesCheckExpectedAndActual::
TestCheckCloseFailureIncludesCheckExpectedAndActual
          (TestCheckCloseFailureIncludesCheckExpectedAndActual *this)

{
  char *suiteName;
  TestCheckCloseFailureIncludesCheckExpectedAndActual *this_local;
  
  suiteName = UnitTestSuite::GetSuiteName();
  UnitTest::Test::Test
            (&this->super_Test,"CheckCloseFailureIncludesCheckExpectedAndActual",suiteName,
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/UnitTest++/src/tests/TestChecks.cpp"
             ,0x92);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__TestCheckCloseFailureIncludesCheckExpectedAndActual_00183be8;
  return;
}

Assistant:

TEST(CheckCloseFailureIncludesCheckExpectedAndActual)
{
    RecordingReporter reporter;
    TestResults results(&reporter);
    const float expected = 0.9f;
    const float actual = 1.1f;
    CheckClose(results, expected, actual, 0.01f, TestDetails("", "", "", 0));

	using namespace std;
    CHECK(strstr(reporter.lastFailedMessage, "xpected 0.9"));
    CHECK(strstr(reporter.lastFailedMessage, "was 1.1"));
}